

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void fts5DoclistIterNext(Fts5DoclistIter *pIter)

{
  byte bVar1;
  int iVar2;
  uchar *p;
  int nPos;
  i64 iDelta;
  u32 local_24;
  u64 local_20;
  
  p = pIter->aPoslist + (long)pIter->nPoslist + (long)pIter->nSize;
  if (p < pIter->aEof) {
    bVar1 = sqlite3Fts5GetVarint(p,&local_20);
    pIter->iRowid = pIter->iRowid + local_20;
    if ((char)p[bVar1] < '\0') {
      iVar2 = sqlite3Fts5GetVarint32(p + bVar1,&local_24);
      pIter->nSize = iVar2;
      pIter->nPoslist = (int)local_24 >> 1;
    }
    else {
      pIter->nPoslist = (uint)(p[bVar1] >> 1);
      pIter->nSize = 1;
    }
    pIter->aPoslist = p + bVar1;
  }
  else {
    pIter->aPoslist = (u8 *)0x0;
  }
  return;
}

Assistant:

static void fts5DoclistIterNext(Fts5DoclistIter *pIter){
  u8 *p = pIter->aPoslist + pIter->nSize + pIter->nPoslist;

  assert( pIter->aPoslist );
  if( p>=pIter->aEof ){
    pIter->aPoslist = 0;
  }else{
    i64 iDelta;

    p += fts5GetVarint(p, (u64*)&iDelta);
    pIter->iRowid += iDelta;

    /* Read position list size */
    if( p[0] & 0x80 ){
      int nPos;
      pIter->nSize = fts5GetVarint32(p, nPos);
      pIter->nPoslist = (nPos>>1);
    }else{
      pIter->nPoslist = ((int)(p[0])) >> 1;
      pIter->nSize = 1;
    }

    pIter->aPoslist = p;
  }
}